

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

PIPELINE_RESOURCE_FLAGS Diligent::GetValidPipelineResourceFlags(SHADER_RESOURCE_TYPE ResourceType)

{
  PIPELINE_RESOURCE_FLAGS PVar1;
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  SHADER_RESOURCE_TYPE ResourceType_local;
  
  msg.field_2._M_local_buf[0xe] = ResourceType;
  switch(ResourceType) {
  case SHADER_RESOURCE_TYPE_CONSTANT_BUFFER:
    msg.field_2._M_local_buf[0xf] =
         operator|(PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS,PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY);
    break;
  case SHADER_RESOURCE_TYPE_TEXTURE_SRV:
    msg.field_2._M_local_buf[0xf] =
         operator|(PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER,PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY);
    break;
  case SHADER_RESOURCE_TYPE_BUFFER_SRV:
    PVar1 = operator|(PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS,
                      PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
    msg.field_2._M_local_buf[0xf] = operator|(PVar1,PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY);
    break;
  case SHADER_RESOURCE_TYPE_TEXTURE_UAV:
    msg.field_2._M_local_buf[0xf] = '\b';
    break;
  case SHADER_RESOURCE_TYPE_BUFFER_UAV:
    PVar1 = operator|(PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS,
                      PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
    msg.field_2._M_local_buf[0xf] = operator|(PVar1,PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY);
    break;
  case SHADER_RESOURCE_TYPE_SAMPLER:
    msg.field_2._M_local_buf[0xf] = '\b';
    break;
  case SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT:
    msg.field_2._M_local_buf[0xf] = '\x10';
    break;
  case SHADER_RESOURCE_TYPE_ACCEL_STRUCT:
    msg.field_2._M_local_buf[0xf] = '\b';
    break;
  default:
    FormatString<char[25]>((string *)local_30,(char (*) [25])"Unexpected resource type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetValidPipelineResourceFlags",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x72b);
    std::__cxx11::string::~string((string *)local_30);
    msg.field_2._M_local_buf[0xf] = '\0';
  }
  return msg.field_2._M_local_buf[0xf];
}

Assistant:

PIPELINE_RESOURCE_FLAGS GetValidPipelineResourceFlags(SHADER_RESOURCE_TYPE ResourceType)
{
    static_assert(SHADER_RESOURCE_TYPE_LAST == 8, "Please update the switch below to handle the new shader resource type");
    switch (ResourceType)
    {
        case SHADER_RESOURCE_TYPE_CONSTANT_BUFFER:
            return PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS | PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        case SHADER_RESOURCE_TYPE_TEXTURE_SRV:
            return PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER | PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        case SHADER_RESOURCE_TYPE_BUFFER_SRV:
            return PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS | PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER | PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        case SHADER_RESOURCE_TYPE_TEXTURE_UAV:
            return PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        case SHADER_RESOURCE_TYPE_BUFFER_UAV:
            return PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS | PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER | PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        case SHADER_RESOURCE_TYPE_SAMPLER:
            return PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        case SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT:
            return PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT;

        case SHADER_RESOURCE_TYPE_ACCEL_STRUCT:
            return PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        default:
            UNEXPECTED("Unexpected resource type");
            return PIPELINE_RESOURCE_FLAG_NONE;
    }
}